

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TDeletingArray<FVoxelDef_*,_FVoxelDef_*>::~TDeletingArray
          (TDeletingArray<FVoxelDef_*,_FVoxelDef_*> *this)

{
  uint uVar1;
  FVoxelDef **ppFVar2;
  uint local_14;
  uint i;
  TDeletingArray<FVoxelDef_*,_FVoxelDef_*> *this_local;
  
  for (local_14 = 0;
      uVar1 = TArray<FVoxelDef_*,_FVoxelDef_*>::Size(&this->super_TArray<FVoxelDef_*,_FVoxelDef_*>),
      local_14 < uVar1; local_14 = local_14 + 1) {
    ppFVar2 = TArray<FVoxelDef_*,_FVoxelDef_*>::operator[]
                        (&this->super_TArray<FVoxelDef_*,_FVoxelDef_*>,(ulong)local_14);
    if (*ppFVar2 != (FVoxelDef *)0x0) {
      ppFVar2 = TArray<FVoxelDef_*,_FVoxelDef_*>::operator[]
                          (&this->super_TArray<FVoxelDef_*,_FVoxelDef_*>,(ulong)local_14);
      if (*ppFVar2 != (FVoxelDef *)0x0) {
        operator_delete(*ppFVar2,0x28);
      }
    }
  }
  TArray<FVoxelDef_*,_FVoxelDef_*>::~TArray(&this->super_TArray<FVoxelDef_*,_FVoxelDef_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}